

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void rtosc::map_arg_vals(rtosc_arg_val_t *av,size_t n,MetaContainer meta)

{
  char *pcVar1;
  rtosc_arg_t *prVar2;
  bool bVar3;
  MetaContainer meta_local;
  char mapbuf [20];
  
  builtin_strncpy(mapbuf,"map ",5);
  mapbuf[5] = '\0';
  mapbuf[6] = '\0';
  mapbuf[7] = '\0';
  mapbuf[8] = '\0';
  mapbuf[9] = '\0';
  mapbuf[10] = '\0';
  mapbuf[0xb] = '\0';
  mapbuf[0xc] = '\0';
  mapbuf[0xd] = '\0';
  mapbuf[0xe] = '\0';
  mapbuf[0xf] = '\0';
  mapbuf[0x10] = '\0';
  mapbuf[0x11] = '\0';
  mapbuf[0x12] = '\0';
  mapbuf[0x13] = '\0';
  prVar2 = &av->val;
  meta_local.str_ptr = meta.str_ptr;
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    if (((rtosc_arg_val_t *)((long)prVar2 + -8))->type == 'i') {
      snprintf(mapbuf + 4,0x10,"%d",(ulong)(uint)prVar2->i);
      pcVar1 = Port::MetaContainer::operator[](&meta_local,mapbuf);
      if (pcVar1 != (char *)0x0) {
        ((rtosc_arg_val_t *)((long)prVar2 + -8))->type = 'S';
        prVar2->s = pcVar1;
      }
    }
    prVar2 = (rtosc_arg_t *)((long)prVar2 + 0x18);
  }
  return;
}

Assistant:

void rtosc::map_arg_vals(rtosc_arg_val_t* av, size_t n,
                         Port::MetaContainer meta)
{
    char mapbuf[20] = "map ";

    for(size_t i = 0; i < n; ++i, ++av)
    {
        if(av->type == 'i')
        {
            snprintf(mapbuf + 4, 16, "%d", av->val.i);
            const char* val = meta[mapbuf];
            if(val)
            {
                av->type = 'S';
                av->val.s = val;
            }
        }
    }
}